

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnElemSegmentElemExpr_RefNull
          (BinaryReaderObjdump *this,Index segment_index,Type type)

{
  uint uVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  string local_48;
  Index local_24;
  BinaryReaderObjdump *pBStack_20;
  Index segment_index_local;
  BinaryReaderObjdump *this_local;
  Type type_local;
  
  uVar2 = this->elem_offset_;
  uVar1 = this->elem_index_;
  local_24 = segment_index;
  pBStack_20 = this;
  unique0x100000c9 = type;
  Type::GetName_abi_cxx11_(&local_48,(Type *)((long)&this_local + 4));
  uVar3 = std::__cxx11::string::c_str();
  PrintDetails(this,"  - elem[%lu] = ref.null %s\n",uVar2 + uVar1,uVar3);
  std::__cxx11::string::~string((string *)&local_48);
  this->elem_index_ = this->elem_index_ + 1;
  Result::Result((Result *)&type_local,Ok);
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnElemSegmentElemExpr_RefNull(Index segment_index,
                                                          Type type) {
  PrintDetails("  - elem[%" PRIu64 "] = ref.null %s\n",
               elem_offset_ + elem_index_, type.GetName().c_str());
  elem_index_++;
  return Result::Ok;
}